

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Const * kratos::Const::constant
                  (string *hex_value,uint32_t num_bits,bool negative,uint32_t width,bool is_signed)

{
  long lVar1;
  invalid_argument *this;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  unsigned_long local_38;
  undefined1 local_30 [8];
  shared_ptr<kratos::Const> p;
  bool is_signed_local;
  uint32_t width_local;
  bool negative_local;
  uint32_t num_bits_local;
  string *hex_value_local;
  
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ =
       is_signed;
  p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = width;
  local_38 = std::numeric_limits<unsigned_long>::max();
  std::make_shared<kratos::Const,unsigned_long,unsigned_int&,bool&>
            ((unsigned_long *)local_30,(uint *)&local_38,
             (bool *)((long)&p.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 4));
  lVar1 = std::__cxx11::string::find_first_not_of((char *)hex_value,0x43fa32);
  if (lVar1 != -1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,"Invalid hex value for constant ",hex_value);
    std::invalid_argument::invalid_argument(this,(string *)&local_58);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar2 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::__cxx11::string::operator=((string *)&peVar2->hex_value_,(string *)hex_value);
  peVar2 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  peVar2->negative_ = negative;
  peVar2 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  peVar2->num_bits_ = num_bits;
  std::
  unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
  ::emplace<std::shared_ptr<kratos::Const>&>
            ((unordered_set<std::shared_ptr<kratos::Const>,std::hash<std::shared_ptr<kratos::Const>>,std::equal_to<std::shared_ptr<kratos::Const>>,std::allocator<std::shared_ptr<kratos::Const>>>
              *)consts_,(shared_ptr<kratos::Const> *)local_30);
  peVar2 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )local_30);
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_30);
  return peVar2;
}

Assistant:

Const &Const::constant(const std::string &hex_value, uint32_t num_bits, bool negative,
                       uint32_t width, bool is_signed) {
    auto p = std::make_shared<Const>(std::numeric_limits<uint64_t>::max(), width, is_signed);
    if (hex_value.find_first_not_of("abcdefABCDEF0123456789") != std::string::npos) {
        throw std::invalid_argument("Invalid hex value for constant " + hex_value);
    }
    p->hex_value_ = hex_value;
    p->negative_ = negative;
    p->num_bits_ = num_bits;
    consts_.emplace(p);
    return *p;
}